

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O0

int Psr_ManReadModel(Psr_Man_t *p)

{
  int iVar1;
  int iToken;
  Psr_Man_t *p_local;
  
  if (p->pNtk == (Psr_Ntk_t *)0x0) {
    iVar1 = Psr_ManReadName(p);
    if (iVar1 == 0) {
      p_local._4_4_ = Psr_ManErrorSet(p,"Cannot read model name.",1);
    }
    else {
      Psr_ManInitializeNtk(p,iVar1,0);
      Psr_ManSkipSpaces(p);
      iVar1 = Psr_ManIsChar(p,'\n');
      if (iVar1 == 0) {
        p_local._4_4_ = Psr_ManErrorSet(p,"Trailing symbols on .model line.",1);
      }
      else {
        p_local._4_4_ = 0;
      }
    }
  }
  else {
    p_local._4_4_ = Psr_ManErrorSet(p,"Parsing previous model is unfinished.",1);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadModel( Psr_Man_t * p )
{
    int iToken;
    if ( p->pNtk != NULL )                         return Psr_ManErrorSet(p, "Parsing previous model is unfinished.", 1);
    iToken = Psr_ManReadName(p);
    if ( iToken == 0 )                             return Psr_ManErrorSet(p, "Cannot read model name.", 1);
    Psr_ManInitializeNtk( p, iToken, 0 );
    Psr_ManSkipSpaces( p );
    if ( !Psr_ManIsChar(p, '\n') )                 return Psr_ManErrorSet(p, "Trailing symbols on .model line.", 1);
    return 0;
}